

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

Timestamp __thiscall Liby::operator-(Liby *this,Timestamp *lhs,Timestamp *rhs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Timestamp TVar4;
  
  lVar2 = (lhs->tv_).tv_usec;
  lVar3 = (rhs->tv_).tv_usec;
  lVar1 = lVar2 + 1000000;
  if (lVar3 <= lVar2) {
    lVar1 = lVar2;
  }
  lVar2 = ((lhs->tv_).tv_sec - (rhs->tv_).tv_sec) - (ulong)(lVar2 < lVar3);
  lVar1 = lVar1 - lVar3;
  *(long *)this = lVar2;
  *(long *)(this + 8) = lVar1;
  if (1000000 < (uint)lVar1) {
    lVar3 = lVar1 % 1000000;
    *(long *)this = lVar1 / 1000000 + lVar2;
    *(long *)(this + 8) = lVar3;
  }
  TVar4.tv_.tv_usec = lVar3;
  TVar4.tv_.tv_sec = (__time_t)this;
  return (Timestamp)TVar4.tv_;
}

Assistant:

suseconds_t usec() const { return tv_.tv_usec; }